

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access-control.c
# Opt level: O0

void ndn_ac_after_bootstrapping(void)

{
  uint8_t local_1dd;
  int local_1dc;
  uint8_t ac;
  ndn_key_storage_t *pnStack_1d8;
  int ret;
  ndn_key_storage_t *storage;
  ndn_name_t name;
  int i_1;
  int i;
  
  if (!_ac_initialized) {
    _init_ac_state();
  }
  name.components_size = '\0';
  name._441_3_ = 0;
  for (; (int)name._440_4_ < 10; name._440_4_ = name._440_4_ + 1) {
    if (_ac_self_state.self_services[(int)name._440_4_] != 0xff) {
      _express_ekey_interest(_ac_self_state.self_services[(int)name._440_4_]);
    }
  }
  ndn_time_delay(10);
  name.components[9].size = '\0';
  name.components[9]._41_3_ = 0;
  for (; (int)name.components[9]._40_4_ < 10;
      name.components[9]._40_4_ = name.components[9]._40_4_ + 1) {
    if (_ac_self_state.access_services[(int)name.components[9]._40_4_] != 0xff) {
      _express_dkey_interest(_ac_self_state.access_services[(int)name.components[9]._40_4_]);
    }
  }
  ndn_name_init((ndn_name_t *)((long)&storage + 4));
  pnStack_1d8 = ndn_key_storage_get_instance();
  local_1dc = 0xffffffff;
  local_1dc = ndn_name_append_component
                        ((ndn_name_t *)((long)&storage + 4),(name_component_t *)pnStack_1d8);
  ndn_name_print((ndn_name_t *)((long)&storage + 4));
  if (local_1dc == 0) {
    local_1dd = '\x03';
    local_1dc = ndn_name_append_bytes_component((ndn_name_t *)((long)&storage + 4),&local_1dd,1);
    local_1dc = ndn_name_append_string_component((ndn_name_t *)((long)&storage + 4),"NOTIFY",6);
    if (local_1dc == 0) {
      local_1dc = ndn_forwarder_register_name_prefix
                            ((ndn_name_t *)((long)&storage + 4),_on_ac_notification,(void *)0x0);
      ndn_name_print((ndn_name_t *)((long)&storage + 4));
      if (local_1dc != 0) {
        printf("ERROR: %s, L%d: ","ndn_ac_after_bootstrapping",0x239);
        printf("[ACCESSCTL] Cannot register notification prefix: ");
        ndn_name_print((ndn_name_t *)((long)&storage + 4));
      }
      _ac_timeout();
    }
  }
  return;
}

Assistant:

void
ndn_ac_after_bootstrapping()
{
  if (!_ac_initialized) {
    _init_ac_state();
  }
  // send /home/AC/EKEY/<the service provided by my self> to the controller
  for (int i = 0; i < 10; i++) {
    if (_ac_self_state.self_services[i] != NDN_SD_NONE) {
      _express_ekey_interest(_ac_self_state.self_services[i]);
    }
  }
  ndn_time_delay(10);
  // send /home/AC/DKEY/<the services that I need to access> to the controller
  for (int i = 0; i < 10; i++) {
    if (_ac_self_state.access_services[i] != NDN_SD_NONE) {
      _express_dkey_interest(_ac_self_state.access_services[i]);
    }
  }
  // e.g. Temp sensor produce under TEMP, access SD
  // 1. send /home/AC/EKEY/TEMP to obtain encryption key
  // 2. send /home/AC/DKEY/SD to obtain decryption key

  // register for notification interest
  ndn_name_t name;
  ndn_name_init(&name);
  ndn_key_storage_t* storage = ndn_key_storage_get_instance();
  int ret = -1;
  ret = ndn_name_append_component(&name, &storage->self_identity[0].components[0]);
    NDN_LOG_ERROR_NAME(&name);
  if (ret != 0) return;
  uint8_t ac = NDN_SD_AC;
  ret = ndn_name_append_bytes_component(&name, &ac, 1);

  // ret = ndn_name_append_string_component(&name, "AC", strlen("AC"));
  // if (ret != 0) return;
  ret = ndn_name_append_string_component(&name, "NOTIFY", strlen("NOTIFY"));
  if (ret != 0) return;
  ret = ndn_forwarder_register_name_prefix(&name, _on_ac_notification, NULL);
  NDN_LOG_ERROR_NAME(&name);
  if (ret != 0) {
    NDN_LOG_ERROR("[ACCESSCTL] Cannot register notification prefix: ");
    NDN_LOG_ERROR_NAME(&name);
  }
  _ac_timeout();
}